

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_dec(runtime_type *this,var *a,var *b)

{
  long lVar1;
  numeric *pnVar2;
  anon_union_16_2_310e9938_for_data *dat;
  runtime_error *prVar3;
  any *in_RCX;
  bool bVar4;
  allocator local_39;
  anon_union_16_2_310e9938_for_data local_38;
  undefined1 local_28;
  
  if (b->mDat == (proxy *)0x0) {
    if (in_RCX->mDat == (proxy *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"Unsupported operator operations(Dec).",&local_39);
      runtime_error::runtime_error(prVar3,(string *)&local_38);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pnVar2 = cs_impl::any::val<cs::numeric>(in_RCX);
    dat = &numeric::operator--(pnVar2)->data;
  }
  else {
    if (in_RCX->mDat != (proxy *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"Unsupported operator operations(Dec).",&local_39);
      runtime_error::runtime_error(prVar3,(string *)&local_38);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pnVar2 = cs_impl::any::val<cs::numeric>(b);
    bVar4 = pnVar2->type != true;
    if (bVar4) {
      local_38._0_10_ = *(unkbyte10 *)&pnVar2->data;
      *(longdouble *)&pnVar2->data = -(longdouble)1 + (longdouble)local_38._0_10_;
    }
    else {
      lVar1 = (pnVar2->data)._int;
      (pnVar2->data)._int = lVar1 + -1;
      local_38._int = lVar1;
    }
    local_28 = !bVar4;
    dat = &local_38;
  }
  cs_impl::any::any<cs::numeric>((any *)this,(numeric *)dat);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_dec(const var &a, const var &b)
	{
		if (a.usable()) {
			if (b.usable())
				throw runtime_error("Unsupported operator operations(Dec).");
			else
				return a.val<numeric>()--;
		}
		else {
			if (!b.usable())
				throw runtime_error("Unsupported operator operations(Dec).");
			else
				return --b.val<numeric>();
		}
	}